

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitSIMDTernary(BinaryInstWriter *this,SIMDTernary *curr)

{
  BufferWithRandomAccess *pBVar1;
  U32LEB local_48;
  U32LEB local_44;
  U32LEB local_40;
  U32LEB local_3c;
  U32LEB local_38;
  U32LEB local_34;
  U32LEB local_30;
  U32LEB local_2c;
  U32LEB local_28;
  U32LEB local_24;
  U32LEB local_20;
  U32LEB local_1c;
  SIMDTernary *local_18;
  SIMDTernary *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (SIMDTernary *)this;
  BufferWithRandomAccess::operator<<(this->o,-3);
  switch(local_18->op) {
  case Bitselect:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x52);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
    break;
  case RelaxedMaddVecF16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_30,0x14e);
    BufferWithRandomAccess::operator<<(pBVar1,local_30);
    break;
  case RelaxedNmaddVecF16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_34,0x14f);
    BufferWithRandomAccess::operator<<(pBVar1,local_34);
    break;
  case RelaxedMaddVecF32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_38,0x105);
    BufferWithRandomAccess::operator<<(pBVar1,local_38);
    break;
  case RelaxedNmaddVecF32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_3c,0x106);
    BufferWithRandomAccess::operator<<(pBVar1,local_3c);
    break;
  case RelaxedMaddVecF64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_40,0x107);
    BufferWithRandomAccess::operator<<(pBVar1,local_40);
    break;
  case RelaxedNmaddVecF64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_44,0x108);
    BufferWithRandomAccess::operator<<(pBVar1,local_44);
    break;
  case LaneselectI8x16:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0x109);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
    break;
  case LaneselectI16x8:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_24,0x10a);
    BufferWithRandomAccess::operator<<(pBVar1,local_24);
    break;
  case LaneselectI32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_28,0x10b);
    BufferWithRandomAccess::operator<<(pBVar1,local_28);
    break;
  case LaneselectI64x2:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,0x10c);
    BufferWithRandomAccess::operator<<(pBVar1,local_2c);
    break;
  case DotI8x16I7x16AddSToVecI32x4:
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_48,0x113);
    BufferWithRandomAccess::operator<<(pBVar1,local_48);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDTernary(SIMDTernary* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix);
  switch (curr->op) {
    case Bitselect:
      o << U32LEB(BinaryConsts::V128Bitselect);
      break;
    case LaneselectI8x16:
      o << U32LEB(BinaryConsts::I8x16Laneselect);
      break;
    case LaneselectI16x8:
      o << U32LEB(BinaryConsts::I16x8Laneselect);
      break;
    case LaneselectI32x4:
      o << U32LEB(BinaryConsts::I32x4Laneselect);
      break;
    case LaneselectI64x2:
      o << U32LEB(BinaryConsts::I64x2Laneselect);
      break;
    case RelaxedMaddVecF16x8:
      o << U32LEB(BinaryConsts::F16x8RelaxedMadd);
      break;
    case RelaxedNmaddVecF16x8:
      o << U32LEB(BinaryConsts::F16x8RelaxedNmadd);
      break;
    case RelaxedMaddVecF32x4:
      o << U32LEB(BinaryConsts::F32x4RelaxedMadd);
      break;
    case RelaxedNmaddVecF32x4:
      o << U32LEB(BinaryConsts::F32x4RelaxedNmadd);
      break;
    case RelaxedMaddVecF64x2:
      o << U32LEB(BinaryConsts::F64x2RelaxedMadd);
      break;
    case RelaxedNmaddVecF64x2:
      o << U32LEB(BinaryConsts::F64x2RelaxedNmadd);
      break;
    case DotI8x16I7x16AddSToVecI32x4:
      o << U32LEB(BinaryConsts::I32x4DotI8x16I7x16AddS);
      break;
  }
}